

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

Gia_Man_t *
Abc_NtkFinMiterToGia
          (Abc_Ntk_t *pNtk,Vec_Int_t *vTypes,Vec_Int_t *vCos,Vec_Int_t *vCis,Vec_Int_t *vNodes,
          int *iObjs,int *Types,Vec_Int_t *vLits)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint iLit0;
  Vec_Int_t *p;
  Gia_Man_t *p_00;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  Gia_Obj_t *pGVar9;
  int *piVar10;
  ulong uVar11;
  Gia_Man_t *pGVar12;
  uint v;
  int iVar13;
  long lVar14;
  ulong uVar15;
  
  p = Vec_IntAlloc(100);
  p_00 = Gia_ManStart(1000);
  pcVar7 = Abc_UtilStrsav(pNtk->pName);
  p_00->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(pNtk->pSpec);
  p_00->pSpec = pcVar7;
  Gia_ManHashStart(p_00);
  for (iVar13 = 0; iVar13 < vCis->nSize; iVar13 = iVar13 + 1) {
    iVar3 = Vec_IntEntry(vCis,iVar13);
    pAVar8 = Abc_NtkObj(pNtk,iVar3);
    if (pAVar8 != (Abc_Obj_t *)0x0) {
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar1 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar1 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pVVar2 = p_00->vCis;
      iVar3 = Gia_ObjId(p_00,pGVar9);
      Vec_IntPush(pVVar2,iVar3);
      iVar3 = Gia_ObjId(p_00,pGVar9);
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        iVar5 = (int)lVar14;
        if (iObjs[lVar14] == pAVar8->Id) {
          iVar6 = Types[lVar14];
          iVar4 = Abc_Var2Lit(iObjs[lVar14],iVar5);
          if (iVar6 == -0x61) {
            iVar5 = Abc_LitNot(iVar3 * 2);
          }
          else {
            iVar5 = Abc_NtkFinSimOneLit(p_00,pAVar8,Types[lVar14],vLits,iVar5,p);
          }
          Vec_IntWriteEntry(vLits,iVar4,iVar5);
        }
        else {
          iVar5 = Abc_Var2Lit(pAVar8->Id,iVar5);
          Vec_IntWriteEntry(vLits,iVar5,iVar3 * 2);
        }
      }
    }
  }
  iVar13 = 0;
  while( true ) {
    if (vNodes->nSize <= iVar13) break;
    iVar3 = Vec_IntEntry(vNodes,iVar13);
    pAVar8 = Abc_NtkObj(pNtk,iVar3);
    if (pAVar8 != (Abc_Obj_t *)0x0) {
      if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
        iVar3 = Mio_GateReadCell((Mio_Gate_t *)(pAVar8->field_5).pData);
      }
      else {
        iVar3 = Vec_IntEntry(vTypes,pAVar8->Id);
      }
      for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
        iVar5 = (int)lVar14;
        if (iObjs[lVar14] == pAVar8->Id) {
          iVar6 = Types[lVar14];
          iVar4 = Abc_Var2Lit(iObjs[lVar14],iVar5);
          if (iVar6 == -0x61) {
            iVar5 = Abc_NtkFinSimOneLit(p_00,pAVar8,iVar3,vLits,iVar5,p);
            iVar5 = Abc_LitNot(iVar5);
          }
          else {
            iVar5 = Abc_NtkFinSimOneLit(p_00,pAVar8,Types[lVar14],vLits,iVar5,p);
          }
          Vec_IntWriteEntry(vLits,iVar4,iVar5);
        }
        else {
          iVar6 = Abc_Var2Lit(pAVar8->Id,iVar5);
          iVar5 = Abc_NtkFinSimOneLit(p_00,pAVar8,iVar3,vLits,iVar5,p);
          Vec_IntWriteEntry(vLits,iVar6,iVar5);
        }
      }
    }
    iVar13 = iVar13 + 1;
  }
  iLit0 = 0;
  for (iVar13 = 0; iVar13 < vCos->nSize; iVar13 = iVar13 + 1) {
    iVar3 = Vec_IntEntry(vCos,iVar13);
    pAVar8 = Abc_NtkObj(pNtk,iVar3);
    if (pAVar8 != (Abc_Obj_t *)0x0) {
      iVar3 = Abc_Var2Lit(*(pAVar8->vFanins).pArray,0);
      piVar10 = Vec_IntEntryP(vLits,iVar3);
      iVar3 = Gia_ManHashXor(p_00,*piVar10,piVar10[1]);
      iLit0 = Gia_ManHashOr(p_00,iLit0,iVar3);
    }
  }
  if ((-1 < (int)iLit0) && (v = iLit0 >> 1, (int)v < p_00->nObjs)) {
    pGVar9 = Gia_ManObj(p_00,v);
    if ((~*(uint *)pGVar9 & 0x1fffffff) == 0 || -1 < (int)*(uint *)pGVar9) {
      pGVar9 = Gia_ManAppendObj(p_00);
      *(ulong *)pGVar9 = *(ulong *)pGVar9 | 0x80000000;
      iVar13 = Gia_ObjId(p_00,pGVar9);
      uVar11 = (ulong)(iVar13 - v & 0x1fffffff);
      uVar1 = *(ulong *)pGVar9;
      uVar15 = (ulong)((iLit0 & 1) << 0x1d);
      *(ulong *)pGVar9 = uVar15 | uVar1 & 0xffffffffc0000000 | uVar11;
      *(ulong *)pGVar9 =
           uVar15 | uVar1 & 0xe0000000c0000000 | uVar11 |
           (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
      pVVar2 = p_00->vCos;
      iVar13 = Gia_ObjId(p_00,pGVar9);
      Vec_IntPush(pVVar2,iVar13);
      if (p_00->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_00,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9);
      }
      Gia_ObjId(p_00,pGVar9);
      pGVar12 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      Vec_IntFree(p);
      return pGVar12;
    }
    __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
  }
  __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Abc_NtkFinMiterToGia( Abc_Ntk_t * pNtk, Vec_Int_t * vTypes, Vec_Int_t * vCos, Vec_Int_t * vCis, Vec_Int_t * vNodes, 
                                  int iObjs[2], int Types[2], Vec_Int_t * vLits )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Abc_Obj_t * pObj; 
    Vec_Int_t * vTemp = Vec_IntAlloc( 100 );
    int n, i, Type, iMiter, iLit, * pLits;
    // create AIG manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( pNtk->pName );
    pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
    Gia_ManHashStart( pNew );
    // create inputs
    Abc_NtkForEachObjVec( vCis, pNtk, pObj, i )
    {
        iLit = Gia_ManAppendCi(pNew);
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), iLit );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(iLit) );
        }
    }
    // create internal nodes
    Abc_NtkForEachObjVec( vNodes, pNtk, pObj, i )
    {
        Type = Abc_NtkIsMappedLogic(pNtk) ? Mio_GateReadCell((Mio_Gate_t *)pObj->pData) : Vec_IntEntry(vTypes, Abc_ObjId(pObj));
        for ( n = 0; n < 2; n++ )
        {
            if ( iObjs[n] != (int)Abc_ObjId(pObj) )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp) );
            else if ( Types[n] != ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_NtkFinSimOneLit(pNew, pObj, Types[n], vLits, n, vTemp) );
            else // if ( iObjs[n] == (int)Abc_ObjId(pObj) && Types[n] == ABC_FIN_NEG )
                Vec_IntWriteEntry( vLits, Abc_Var2Lit(Abc_ObjId(pObj), n), Abc_LitNot(Abc_NtkFinSimOneLit(pNew, pObj, Type, vLits, n, vTemp)) );
        }
    }
    // create comparator
    iMiter = 0;
    Abc_NtkForEachObjVec( vCos, pNtk, pObj, i )
    {
        pLits  = Vec_IntEntryP( vLits, Abc_Var2Lit(Abc_ObjFaninId0(pObj), 0) );
        iLit   = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
        iMiter = Gia_ManHashOr( pNew, iMiter, iLit );
    }
    Gia_ManAppendCo( pNew, iMiter );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    Vec_IntFree( vTemp );
    return pNew;
}